

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

Symbol * __thiscall
slang::ast::PackageSymbol::findForImport(PackageSymbol *this,string_view lookupName)

{
  PackageImportItemSyntax *pPVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar2;
  uint n_;
  SymbolMap *pSVar3;
  size_t sVar4;
  group_type *pgVar5;
  value_type *pvVar6;
  pointer ppVar7;
  TransparentMemberSymbol *pTVar8;
  pointer ppVar9;
  reference ppPVar10;
  long in_RDI;
  iterator iVar11;
  PackageImportItemSyntax *decl;
  iterator __end3;
  iterator __begin3;
  span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL> *__range3;
  Scope *targetScope;
  Symbol *packageParent;
  Symbol *symbol_1;
  iterator it_1;
  WildcardImportData *wildcardData;
  Symbol *symbol;
  const_iterator it;
  SymbolMap *scopeNameMap;
  size_t hash_1;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffcd8;
  Scope *in_stack_fffffffffffffce0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffce8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffcf0;
  Token *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffcf8;
  basic_string_view<char,_std::char_traits<char>_> *__x_01;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffd00;
  Token *this_01;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffd10;
  ExplicitImportSymbol *in_stack_fffffffffffffd68;
  __normal_iterator<const_slang::syntax::PackageImportItemSyntax_*const_*,_std::span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>_>
  local_270;
  long local_268;
  Scope *local_260;
  Symbol *local_258;
  Symbol *local_250;
  iterator local_248;
  char_pointer local_238;
  table_element_pointer local_230;
  WildcardImportData *local_228;
  Symbol *local_220;
  const_iterator local_218;
  char_pointer local_208;
  table_element_pointer local_200;
  SymbolMap *local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  Symbol *local_1d8;
  basic_string_view<char,_std::char_traits<char>_> *local_1d0;
  SymbolMap *local_1c8;
  char_pointer local_1c0;
  table_element_pointer local_1b8;
  basic_string_view<char,_std::char_traits<char>_> *local_1b0;
  SymbolMap *local_1a8;
  char_pointer local_1a0;
  table_element_pointer local_198;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_190;
  basic_string_view<char,_std::char_traits<char>_> *local_180;
  SymbolMap *local_178;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_170;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_160;
  basic_string_view<char,_std::char_traits<char>_> *local_148;
  SymbolMap *local_140;
  iterator local_138;
  Symbol *in_stack_fffffffffffffed8;
  Compilation *in_stack_fffffffffffffee0;
  char_pointer local_100;
  table_element_pointer local_f8;
  uint local_a4;
  pow2_quadratic_prober local_90;
  size_t local_80;
  size_t local_78;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  SymbolMap *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  Token *local_8;
  
  pSVar3 = Scope::getNameMap(in_stack_fffffffffffffce0);
  local_1f8 = pSVar3;
  local_1d0 = &local_1e8;
  local_1c8 = pSVar3;
  local_180 = &local_1e8;
  local_178 = pSVar3;
  local_148 = &local_1e8;
  local_140 = pSVar3;
  sVar4 = boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
          ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                    ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                      *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  local_78 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
             ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                             *)in_stack_fffffffffffffce0,(size_t)in_stack_fffffffffffffcd8);
  local_80 = sVar4;
  local_70 = &local_1e8;
  local_68 = pSVar3;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_90,local_78);
  do {
    sVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_90);
    pgVar5 = boost::unordered::detail::foa::
             table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
             ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                       *)0xbf3574);
    local_a4 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_fffffffffffffce8,(size_t)in_stack_fffffffffffffce0);
    if (local_a4 != 0) {
      pvVar6 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
               ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                           *)0xbf35bf);
      do {
        n_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffd10 =
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                     *)0xbf360f);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                    *)0xbf363c);
        bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                           in_stack_fffffffffffffcf0);
        if (bVar2) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
          ::table_locator(&local_160,pgVar5 + sVar4,n_,pvVar6 + sVar4 * 0xf + (ulong)n_);
          goto LAB_00bf3730;
        }
        local_a4 = local_a4 - 1 & local_a4;
      } while (local_a4 != 0);
    }
    bVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffce0,(size_t)in_stack_fffffffffffffcd8);
    if (bVar2) {
      memset(&local_160,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
      ::table_locator(&local_160);
      goto LAB_00bf3730;
    }
    bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_90,
                       (pSVar3->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                       .arrays.groups_size_mask);
  } while (bVar2);
  memset(&local_160,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  ::table_locator(&local_160);
LAB_00bf3730:
  local_138 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
              ::make_iterator((locator *)0xbf373d);
  local_190.pc_ = local_138.pc_;
  local_190.p_ = local_138.p_;
  boost::unordered::detail::foa::
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  ::table_iterator<false,_nullptr>(&local_170,&local_190);
  local_1c0 = local_170.pc_;
  local_1b8 = local_170.p_;
  local_208 = local_170.pc_;
  local_200 = local_170.p_;
  local_218 = boost::unordered::
              unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
              ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                     *)0xbf37cf);
  bVar2 = boost::unordered::detail::foa::operator!=
                    ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffce0,
                     (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffcd8);
  if (bVar2) {
    ppVar7 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                           *)in_stack_fffffffffffffce0);
    local_220 = ppVar7->second;
    while (local_220->kind == TransparentMember) {
      pTVar8 = Symbol::as<slang::ast::TransparentMemberSymbol>((Symbol *)0xbf3830);
      local_220 = pTVar8->wrapped;
    }
    if (local_220->kind == ForwardingTypedef) {
      local_1d8 = (Symbol *)0x0;
    }
    else if (local_220->kind == ExplicitImport) {
      Symbol::as<slang::ast::ExplicitImportSymbol>((Symbol *)0xbf386b);
      local_1d8 = ExplicitImportSymbol::importedSymbol(in_stack_fffffffffffffd68);
    }
    else {
      local_1d8 = local_220;
    }
  }
  else {
    local_228 = Scope::getWildcardImportData((Scope *)(in_RDI + 0x40));
    if ((local_228 == (WildcardImportData *)0x0) ||
       (((*(byte *)(in_RDI + 0xa0) & 1) == 0 &&
        (bVar2 = std::
                 span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>::
                 empty((span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>
                        *)0xbf38e6), bVar2)))) {
      local_1d8 = (Symbol *)0x0;
    }
    else {
      if ((local_228->hasForceElaborated & 1U) == 0) {
        local_228->hasForceElaborated = true;
        Scope::getCompilation((Scope *)(in_RDI + 0x40));
        Compilation::forceElaborate(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      }
      this_00 = (Token *)&local_228->importedSymbols;
      __x_01 = &local_1e8;
      local_1b0 = __x_01;
      local_1a8 = (SymbolMap *)this_00;
      sVar4 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                          *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      local_18 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                 *)in_stack_fffffffffffffce0,(size_t)in_stack_fffffffffffffcd8);
      this_01 = this_00;
      local_20 = sVar4;
      local_10 = __x_01;
      local_8 = this_00;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_18);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                   ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                             *)0xbf3a4d);
        local_40 = local_40 + local_38;
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffce8,(size_t)in_stack_fffffffffffffce0);
        if (local_44 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                     ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                 *)0xbf3a98);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffffce0 =
                 (Scope *)boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                  *)0xbf3ae8);
            in_stack_fffffffffffffce8 = local_10;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
            ::
            key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>
                      ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                        *)0xbf3b15);
            bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               this_01,__x_01,
                               (basic_string_view<char,_std::char_traits<char>_> *)this_00);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
              ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                               *)&stack0xfffffffffffffed8,local_40,local_5c,local_58 + local_5c);
              goto LAB_00bf3c09;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffce0,(size_t)in_stack_fffffffffffffcd8);
        if (bVar2) {
          memset(&stack0xfffffffffffffed8,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
          ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                           *)&stack0xfffffffffffffed8);
          goto LAB_00bf3c09;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,(size_t)this_01->info);
      } while (bVar2);
      memset(&stack0xfffffffffffffed8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
      ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                       *)&stack0xfffffffffffffed8);
LAB_00bf3c09:
      iVar11 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
               ::make_iterator((locator *)0xbf3c16);
      local_100 = iVar11.pc_;
      local_f8 = iVar11.p_;
      local_1a0 = local_100;
      local_198 = local_f8;
      local_238 = local_100;
      local_230 = local_f8;
      local_248 = boost::unordered::
                  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                  ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                         *)0xbf3c77);
      bVar2 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffce0,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffcd8);
      if (bVar2) {
        ppVar9 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)0xbf3cb2);
        local_250 = ppVar9->second;
        if ((*(byte *)(in_RDI + 0xa0) & 1) != 0) {
          return local_250;
        }
        local_260 = Symbol::getParentScope(local_250);
        while (local_258 = Scope::asSymbol(local_260), local_258->kind != Package) {
          local_260 = Symbol::getParentScope(local_258);
        }
        local_268 = in_RDI + 0x90;
        local_270._M_current =
             (PackageImportItemSyntax **)
             std::span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>
             ::begin((span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>
                      *)in_stack_fffffffffffffcd8);
        std::span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>::end
                  ((span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>
                    *)in_stack_fffffffffffffce8);
        while (bVar2 = __gnu_cxx::
                       operator==<const_slang::syntax::PackageImportItemSyntax_*const_*,_std::span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>_>
                                 ((__normal_iterator<const_slang::syntax::PackageImportItemSyntax_*const_*,_std::span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffce0,
                                  (__normal_iterator<const_slang::syntax::PackageImportItemSyntax_*const_*,_std::span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffcd8), ((bVar2 ^ 0xffU) & 1) != 0) {
          ppPVar10 = __gnu_cxx::
                     __normal_iterator<const_slang::syntax::PackageImportItemSyntax_*const_*,_std::span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>_>
                     ::operator*(&local_270);
          pPVar1 = *ppPVar10;
          parsing::Token::valueText(this_00);
          __x._M_len._4_4_ = in_stack_fffffffffffffd0c;
          __x._M_len._0_4_ = in_stack_fffffffffffffd08;
          __x._M_str = (char *)in_stack_fffffffffffffd10;
          __y._M_str = (char *)this_01;
          __y._M_len = (size_t)__x_01;
          bVar2 = std::operator==(__x,__y);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            if ((pPVar1->item).kind == Star) {
              return local_250;
            }
            parsing::Token::valueText(this_00);
            __x_00._M_len._4_4_ = in_stack_fffffffffffffd0c;
            __x_00._M_len._0_4_ = in_stack_fffffffffffffd08;
            __x_00._M_str = (char *)in_stack_fffffffffffffd10;
            __y_00._M_str = (char *)this_01;
            __y_00._M_len = (size_t)__x_01;
            bVar2 = std::operator==(__x_00,__y_00);
            if (bVar2) {
              return local_250;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_slang::syntax::PackageImportItemSyntax_*const_*,_std::span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>_>
          ::operator++(&local_270);
        }
      }
      local_1d8 = (Symbol *)0x0;
    }
  }
  return local_1d8;
}

Assistant:

const Symbol* PackageSymbol::findForImport(std::string_view lookupName) const {
    auto& scopeNameMap = getNameMap();
    if (auto it = scopeNameMap.find(lookupName); it != scopeNameMap.end()) {
        auto symbol = it->second;
        while (symbol->kind == SymbolKind::TransparentMember)
            symbol = &symbol->as<TransparentMemberSymbol>().wrapped;

        switch (symbol->kind) {
            case SymbolKind::ExplicitImport:
                return symbol->as<ExplicitImportSymbol>().importedSymbol();
            case SymbolKind::ForwardingTypedef:
                return nullptr;
            default:
                return symbol;
        }
    }

    auto wildcardData = getWildcardImportData();
    if (!wildcardData || (!hasExportAll && exportDecls.empty()))
        return nullptr;

    // We need to force-elaborate the entire package body because any
    // lookups that result in a wildcard import could add to our export list.
    if (!wildcardData->hasForceElaborated) {
        wildcardData->hasForceElaborated = true;
        getCompilation().forceElaborate(*this);
    }

    // Look through symbols that have been wildcard imported with this name.
    if (auto it = wildcardData->importedSymbols.find(lookupName);
        it != wildcardData->importedSymbols.end()) {

        auto symbol = it->second;
        if (hasExportAll)
            return symbol;

        // If we don't have an export-all directive then we need to check
        // whether we wanted to actually export this symbol.
        // First find the package that owns the target symbol.
        const Symbol* packageParent;
        auto targetScope = symbol->getParentScope();
        while (true) {
            SLANG_ASSERT(targetScope);
            packageParent = &targetScope->asSymbol();
            if (packageParent->kind == SymbolKind::Package)
                break;

            targetScope = packageParent->getParentScope();
        }

        // Now look for a matching export.
        for (auto decl : exportDecls) {
            if (decl->package.valueText() != packageParent->name)
                continue;

            if (decl->item.kind == TokenKind::Star || decl->item.valueText() == symbol->name)
                return symbol;
        }
    }

    return nullptr;
}